

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_systemz.c
# Opt level: O0

void print_insn_detail(cs_insn *ins)

{
  uint8_t *puVar1;
  int iVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  cs_sysz_op *op;
  int i;
  cs_sysz *sysz;
  cs_insn *ins_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar3 = ins->detail;
    if ((pcVar3->field_6).x86.opcode[0] != '\0') {
      printf("\top_count: %u\n",(ulong)(pcVar3->field_6).x86.opcode[0]);
    }
    for (op._4_4_ = 0; (int)op._4_4_ < (int)(uint)(pcVar3->field_6).x86.opcode[0];
        op._4_4_ = op._4_4_ + 1) {
      puVar1 = pcVar3->groups + (long)(int)op._4_4_ * 0x20 + 0x16;
      iVar2 = *(int *)puVar1;
      if (iVar2 == 1) {
        pcVar4 = cs_reg_name(handle,*(uint *)(puVar1 + 8));
        printf("\t\toperands[%u].type: REG = %s\n",(ulong)op._4_4_,pcVar4);
      }
      else if (iVar2 == 2) {
        printf("\t\toperands[%u].type: IMM = 0x%lx\n",(ulong)op._4_4_,*(undefined8 *)(puVar1 + 8));
      }
      else if (iVar2 == 3) {
        printf("\t\toperands[%u].type: MEM\n",(ulong)op._4_4_);
        if (puVar1[8] != '\0') {
          pcVar4 = cs_reg_name(handle,(uint)puVar1[8]);
          printf("\t\t\toperands[%u].mem.base: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (puVar1[9] != '\0') {
          pcVar4 = cs_reg_name(handle,(uint)puVar1[9]);
          printf("\t\t\toperands[%u].mem.index: REG = %s\n",(ulong)op._4_4_,pcVar4);
        }
        if (*(long *)(puVar1 + 0x10) != 0) {
          printf("\t\t\toperands[%u].mem.length: 0x%lx\n",(ulong)op._4_4_,
                 *(undefined8 *)(puVar1 + 0x10));
        }
        if (*(long *)(puVar1 + 0x18) != 0) {
          printf("\t\t\toperands[%u].mem.disp: 0x%lx\n",(ulong)op._4_4_,
                 *(undefined8 *)(puVar1 + 0x18));
        }
      }
      else if (iVar2 == 0x40) {
        printf("\t\toperands[%u].type: ACREG = %u\n",(ulong)op._4_4_,(ulong)*(uint *)(puVar1 + 8));
      }
    }
    if ((pcVar3->field_6).arm64.cc != ARM64_CC_INVALID) {
      printf("\tCode condition: %u\n",(ulong)(pcVar3->field_6).arm64.cc);
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_insn_detail(cs_insn *ins)
{
	cs_sysz *sysz;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	sysz = &(ins->detail->sysz);
	if (sysz->op_count)
		printf("\top_count: %u\n", sysz->op_count);

	for (i = 0; i < sysz->op_count; i++) {
		cs_sysz_op *op = &(sysz->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case SYSZ_OP_REG:
				printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case SYSZ_OP_ACREG:
				printf("\t\toperands[%u].type: ACREG = %u\n", i, op->reg);
				break;
			case SYSZ_OP_IMM:
				printf("\t\toperands[%u].type: IMM = 0x%"PRIx64"\n", i, op->imm);
				break;
			case SYSZ_OP_MEM:
				printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != SYSZ_REG_INVALID)
					printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != SYSZ_REG_INVALID)
					printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.length != 0)
					printf("\t\t\toperands[%u].mem.length: 0x%"PRIx64"\n", i, op->mem.length);
				if (op->mem.disp != 0)
					printf("\t\t\toperands[%u].mem.disp: 0x%"PRIx64"\n", i, op->mem.disp);

				break;
		}
	}

	if (sysz->cc != 0)
		printf("\tCode condition: %u\n", sysz->cc);

	printf("\n");
}